

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  long *plVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  Index IVar5;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar6;
  undefined8 *puVar7;
  pointer *__ptr;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_38;
  
  if (decl->has_func_type == false) {
    IVar5 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar5 == 0xffffffff) {
      tVar6.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           operator_new(0x48);
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) =
           0;
      *(undefined ***)
       tVar6.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__ModuleField_001a3a50;
      pcVar2 = (loc->filename)._M_str;
      sVar3 = (loc->field_1).field_1.offset;
      lVar4 = *(long *)((long)&loc->field_1 + 8);
      *(size_t *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) =
           (loc->filename)._M_len;
      *(char **)((long)tVar6.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) =
           pcVar2;
      *(size_t *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = sVar3;
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) =
           lVar4;
      *(undefined4 *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
      *(undefined ***)
       tVar6.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__TypeModuleField_001a39c8;
      *(long *)((long)tVar6.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
           0;
      puVar7 = (undefined8 *)operator_new(0x88);
      puVar7[1] = 0;
      puVar7[2] = 0;
      *(undefined8 *)((long)puVar7 + 0x14) = 0;
      *(undefined8 *)((long)puVar7 + 0x1c) = 0;
      puVar7[5] = puVar7 + 7;
      puVar7[6] = 0;
      *(undefined1 *)(puVar7 + 7) = 0;
      *(undefined4 *)(puVar7 + 9) = 0;
      *puVar7 = &PTR__FuncType_001a3a70;
      puVar7[10] = 0;
      puVar7[0xb] = 0;
      puVar7[0xc] = 0;
      puVar7[0xd] = 0;
      puVar7[0xe] = 0;
      puVar7[0xf] = 0;
      *(undefined1 *)(puVar7 + 0x10) = 0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(puVar7 + 10),
                 &(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(puVar7 + 0xd),
                 &(decl->sig).result_types);
      plVar1 = *(long **)((long)tVar6.
                                super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                                .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl
                         + 0x40);
      *(undefined8 **)
       ((long)tVar6.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) = puVar7;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      local_38._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           tVar6.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)&local_38);
      if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
          local_38._M_t.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl !=
          (TypeModuleField *)0x0) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                    8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = std::make_unique<TypeModuleField>(loc);
      auto func_type = std::make_unique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}